

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O3

EquivalenceMap *
libcellml::rebaseEquivalenceMap
          (EquivalenceMap *__return_storage_ptr__,EquivalenceMap *map,IndexStack *originStack,
          IndexStack *destinationStack)

{
  _Rb_tree_header *p_Var1;
  pointer pvVar2;
  _Base_ptr p_Var3;
  pointer __x;
  IndexStack rebasedTarget;
  size_t variableIndex;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  rebasedVector;
  vector<unsigned_long,_std::allocator<unsigned_long>_> stack;
  IndexStack rebasedKey;
  vector<unsigned_long,_std::allocator<unsigned_long>_> key;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  vector;
  unsigned_long *local_d8;
  iterator local_d0;
  unsigned_long *local_c8;
  unsigned_long local_c0;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_b8;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_a0;
  _Base_ptr local_88;
  _Base_ptr local_80;
  IndexStack local_78;
  vector<unsigned_long,_std::allocator<unsigned_long>_> local_60;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  local_48;
  
  p_Var1 = &(__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (__return_storage_ptr__->_M_t)._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var3 = (map->_M_t)._M_impl.super__Rb_tree_header._M_header._M_left;
  local_88 = &(map->_M_t)._M_impl.super__Rb_tree_header._M_header;
  if (p_Var3 != local_88) {
    do {
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
                (&local_60,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)(p_Var3 + 1));
      rebaseIndexStack(&local_78,&local_60,originStack,destinationStack);
      local_80 = p_Var3;
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::vector(&local_48,
               (vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                *)&p_Var3[1]._M_right);
      pvVar2 = local_48.
               super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      local_b8.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_b8.
      super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __x = local_48.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
      if (local_48.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_48.
          super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector(&local_a0,__x);
          local_c0 = local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                     _M_impl.super__Vector_impl_data._M_finish[-1];
          local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_finish =
               local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
               super__Vector_impl_data._M_finish + -1;
          rebaseIndexStack((IndexStack *)&local_d8,&local_a0,originStack,destinationStack);
          if (local_d8 != local_d0._M_current) {
            if (local_d0._M_current == local_c8) {
              std::vector<unsigned_long,std::allocator<unsigned_long>>::
              _M_realloc_insert<unsigned_long_const&>
                        ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_d8,local_d0,
                         &local_c0);
            }
            else {
              *local_d0._M_current = local_c0;
              local_d0._M_current = local_d0._M_current + 1;
            }
            std::
            vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ::push_back(&local_b8,(value_type *)&local_d8);
          }
          if (local_d8 != (unsigned_long *)0x0) {
            operator_delete(local_d8,(long)local_c8 - (long)local_d8);
          }
          if (local_a0.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            operator_delete(local_a0.
                            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                            _M_impl.super__Vector_impl_data._M_start,
                            (long)local_a0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage -
                            (long)local_a0.
                                  super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
          }
          __x = __x + 1;
        } while (__x != pvVar2);
        if (local_b8.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start !=
            local_b8.
            super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          std::
          _Rb_tree<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::_Select1st<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::less<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
          ::
          _M_emplace_unique<std::vector<unsigned_long,std::allocator<unsigned_long>>&,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>&>
                    ((_Rb_tree<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>,std::_Select1st<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>,std::less<std::vector<unsigned_long,std::allocator<unsigned_long>>>,std::allocator<std::pair<std::vector<unsigned_long,std::allocator<unsigned_long>>const,std::vector<std::vector<unsigned_long,std::allocator<unsigned_long>>,std::allocator<std::vector<unsigned_long,std::allocator<unsigned_long>>>>>>>
                      *)__return_storage_ptr__,&local_78,&local_b8);
        }
      }
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_b8);
      std::
      vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
      ::~vector(&local_48);
      if (local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_78.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_78.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var3 = local_80;
      if (local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_60.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_60.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_60.
                              super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      p_Var3 = (_Base_ptr)std::_Rb_tree_increment(p_Var3);
    } while (p_Var3 != local_88);
  }
  return __return_storage_ptr__;
}

Assistant:

EquivalenceMap rebaseEquivalenceMap(const EquivalenceMap &map, const IndexStack &originStack, const IndexStack &destinationStack)
{
    EquivalenceMap rebasedMap;
    for (const auto &entry : map) {
        auto key = entry.first;
        auto rebasedKey = rebaseIndexStack(key, originStack, destinationStack);
        auto vector = entry.second;
        std::vector<IndexStack> rebasedVector;
        for (auto stack : vector) {
            // Temporarily remove the variable index whilst we rebase the component part of the stack.
            size_t variableIndex = stack.back();
            stack.pop_back();
            auto rebasedTarget = rebaseIndexStack(stack, originStack, destinationStack);
            if (!rebasedTarget.empty()) {
                rebasedTarget.push_back(variableIndex);
                rebasedVector.push_back(rebasedTarget);
            }
        }

        if (!rebasedVector.empty()) {
            rebasedMap.emplace(rebasedKey, rebasedVector);
        }
    }

    return rebasedMap;
}